

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set_test.cc
# Opt level: O2

void __thiscall
phmap::priv::anon_unknown_0::RawHashSamplerTest_DISABLED_Sample_Test::TestBody
          (RawHashSamplerTest_DISABLED_Sample_Test *this)

{
  undefined8 *puVar1;
  pointer __first;
  pointer __last;
  _Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  *this_00;
  pointer __result;
  pointer pIVar2;
  code *__alloc;
  char *extraout_RDX;
  char *extraout_RDX_00;
  long lVar3;
  raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
  *in_RSI;
  int iVar4;
  bool bVar5;
  char *in_stack_ffffffffffffff68;
  char *pcVar6;
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  tables;
  double in_stack_ffffffffffffff90;
  AssertHelper in_stack_ffffffffffffff98;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  AssertionResult gtest_ar;
  undefined8 local_38;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar._0_8_ = &local_38;
  __alloc = std::
            _Function_handler<void_(const_phmap::priv::HashtablezInfo_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc:1868:33)>
            ::_M_manager;
  local_38 = 0;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  tables.
  super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  tables.
  super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tables.
  super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar4 = 1000000;
  pcVar6 = extraout_RDX;
  while( true ) {
    __last = tables.
             super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar5 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar5) break;
    if (tables.
        super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        tables.
        super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_00 = (_Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                 *)std::
                   vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                   ::_M_check_len(&tables,(size_type)in_RSI,pcVar6);
      __first = tables.
                super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      __result = std::
                 _Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                 ::_M_allocate(this_00,(size_t)in_RSI);
      lVar3 = (long)__last - (long)__first;
      *(undefined1 **)((long)__result + lVar3) =
           EmptyGroup<std::is_same<std::allocator<long>,std::allocator<long>>>()::empty_group;
      *(undefined8 *)((long)__result + lVar3 + 0x28) = 0;
      puVar1 = (undefined8 *)((long)__result + lVar3 + 8);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)__result + lVar3 + 0x18) = 0;
      pIVar2 = std::
               vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
               ::_S_relocate(__first,__last,__result,(_Tp_alloc_type *)__alloc);
      pIVar2 = std::
               vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
               ::_S_relocate(__last,__last,pIVar2 + 1,(_Tp_alloc_type *)__alloc);
      __alloc = (code *)0x30;
      std::
      _Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
      ::_M_deallocate((_Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                       *)__first,(pointer)(lVar3 / 0x30),lVar3 % 0x30);
      tables.
      super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)this_00;
      tables.
      super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
    }
    else {
      ((tables.
        super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ).ctrl_ = EmptyGroup<std::is_same<std::allocator<long>,std::allocator<long>>>()::empty_group;
      ((tables.
        super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ).settings_.
      super__Tuple_impl<0UL,_unsigned_long,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      .super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = 0;
      ((tables.
        super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ).slots_ = (slot_type *)0x0;
      ((tables.
        super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ).size_ = 0;
      ((tables.
        super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
        ._M_impl.super__Vector_impl_data._M_finish)->
      super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
      ).capacity_ = 0;
      pIVar2 = tables.
               super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
               ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    in_RSI = &pIVar2[-1].
              super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ;
    tables.
    super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
    raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>
    ::emplace<int,_0>((pair<phmap::priv::raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::Hash<long>,_std::equal_to<long>,_std::allocator<long>_>::iterator,_bool>
                       *)&gtest_ar,in_RSI,(int *)&stack0xffffffffffffff70);
    pcVar6 = extraout_RDX_00;
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  pcVar6 = (char *)0x0;
  gtest_ar._0_8_ = &stack0xffffffffffffff70;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  testing::internal::DoubleNearPredFormat
            (pcVar6,in_stack_ffffffffffffff68,
             (char *)tables.
                     super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                     ._M_impl.super__Vector_impl_data._M_start,
             (double)in_stack_ffffffffffffff98.data_,in_stack_ffffffffffffff90,
             (double)tables.
                     super__Vector_base<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_60);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/raw_hash_set_test.cc"
               ,0x757,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffff98,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff98);
    if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )local_60._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_60._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::
  vector<phmap::priv::(anonymous_namespace)::IntTable,_std::allocator<phmap::priv::(anonymous_namespace)::IntTable>_>
  ::~vector(&tables);
  return;
}

Assistant:

TEST(RawHashSamplerTest, DISABLED_Sample) {
  // Enable the feature even if the prod default is off.
  SetHashtablezEnabled(true);
  SetHashtablezSampleParameter(100);

  auto& sampler = HashtablezSampler::Global();
  size_t start_size = 0;
  start_size += sampler.Iterate([&](const HashtablezInfo&) { ++start_size; });

  std::vector<IntTable> tables;
  for (int i = 0; i < 1000000; ++i) {
    tables.emplace_back();
    tables.back().insert(1);
  }
  size_t end_size = 0;
  end_size += sampler.Iterate([&](const HashtablezInfo&) { ++end_size; });

  EXPECT_NEAR((end_size - start_size) / static_cast<double>(tables.size()),
              0.01, 0.005);
}